

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

reg_desc_t * find_rd_by_reg(MIR_context_t ctx,MIR_reg_t reg,MIR_func_t func)

{
  undefined8 *puVar1;
  reg_desc_t obj;
  int iVar2;
  size_t el;
  reg_desc_t *prVar3;
  uint uVar4;
  size_t rdn;
  reg_desc_t rd;
  reg_desc_t local_40;
  
  puVar1 = (undefined8 *)func->internal;
  rd.name = (char *)0x0;
  rd.type = MIR_T_I64;
  rd.reg = reg;
  el = VARR_reg_desc_tlength((VARR_reg_desc_t *)*puVar1);
  obj.reg = rd.reg;
  obj.type = rd.type;
  obj.name = rd.name;
  obj.hard_reg_name = rd.hard_reg_name;
  VARR_reg_desc_tpush((VARR_reg_desc_t *)*puVar1,obj);
  iVar2 = HTAB_size_t_do((HTAB_size_t *)puVar1[3],el,HTAB_FIND,&rdn);
  if (iVar2 != 0) {
    VARR_reg_desc_tpop(&local_40,(VARR_reg_desc_t *)*puVar1);
    prVar3 = VARR_reg_desc_taddr((VARR_reg_desc_t *)*puVar1);
    return prVar3 + rdn;
  }
  VARR_reg_desc_tpop(&local_40,(VARR_reg_desc_t *)*puVar1);
  uVar4 = 0xf;
  (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared reg %u of func %s",(ulong)reg,
                     func->name);
  if (uVar4 < 0xe) {
    return (reg_desc_t *)(&DAT_00179a30 + *(int *)(&DAT_00179a30 + (ulong)uVar4 * 4));
  }
  return (reg_desc_t *)0x17b543;
}

Assistant:

static reg_desc_t *find_rd_by_reg (MIR_context_t ctx, MIR_reg_t reg, MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.reg = reg;
  rd.name = NULL;
  rd.type = MIR_T_I64; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->reg2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    MIR_get_error_func (ctx) (MIR_undeclared_func_reg_error, "undeclared reg %u of func %s", reg,
                              func->name);
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}